

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::BlitNearestFilterConsistencyCase::compare
          (BlitNearestFilterConsistencyCase *this,Surface *reference,Surface *result)

{
  ostringstream *poVar1;
  int iVar2;
  RGBA RVar3;
  bool bVar4;
  RGBA threshold;
  RenderTarget *pRVar5;
  TestLog *pTVar6;
  void *pvVar7;
  Surface *pSVar8;
  int iVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  int iVar15;
  LogImageSet *this_00;
  int dx;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  size_type sVar21;
  void *pvVar22;
  bool bVar23;
  reference rVar24;
  reference rVar25;
  allocator<char> local_487;
  byte local_486;
  allocator<char> local_485;
  allocator<char> local_484;
  allocator<char> local_483;
  allocator<char> local_482;
  allocator<char> local_481;
  RGBA cellColorA;
  RGBA cellColorB;
  Surface errorMask;
  string local_428;
  string local_408;
  undefined1 local_3e8 [32];
  string local_3c8;
  string local_3a8;
  string local_388;
  LogImageSet local_368;
  vector<bool,_std::allocator<bool>_> verticalSign;
  vector<bool,_std::allocator<bool>_> horisontalSign;
  LogImage local_2d8;
  LogImage local_240;
  undefined1 local_1b0 [384];
  
  tcu::RGBA::RGBA(&cellColorA,&(this->super_BlitRectCase).m_gridCellColorA);
  tcu::RGBA::RGBA(&cellColorB,&(this->super_BlitRectCase).m_gridCellColorB);
  pRVar5 = Context::getRenderTarget
                     ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.m_context);
  local_1b0._0_4_ = tcu::PixelFormat::getColorThreshold(&pRVar5->m_pixelFormat);
  local_2d8.m_name._M_dataplus._M_p._0_4_ = 0x7070707;
  threshold = tcu::operator+((RGBA *)local_1b0,(RGBA *)&local_2d8);
  iVar11 = (this->super_BlitRectCase).m_dstRect.m_data[2];
  iVar13 = (this->super_BlitRectCase).m_dstRect.m_data[0];
  iVar18 = (this->super_BlitRectCase).m_dstRect.m_data[1];
  iVar16 = iVar11;
  if (iVar13 < iVar11) {
    iVar16 = iVar13;
  }
  iVar2 = result->m_width;
  iVar19 = result->m_height;
  if (iVar11 < iVar13) {
    iVar11 = iVar13;
  }
  iVar13 = iVar2;
  if (iVar16 < iVar2) {
    iVar13 = iVar16;
  }
  iVar12 = 0;
  if (iVar16 < 0) {
    iVar13 = iVar12;
  }
  iVar16 = (this->super_BlitRectCase).m_dstRect.m_data[3];
  iVar9 = iVar16;
  if (iVar18 < iVar16) {
    iVar9 = iVar18;
  }
  iVar15 = iVar19;
  if (iVar9 < iVar19) {
    iVar15 = iVar9;
  }
  if (iVar9 < 0) {
    iVar15 = iVar12;
  }
  iVar9 = iVar2;
  if (iVar11 < iVar2) {
    iVar9 = iVar11;
  }
  if (iVar11 < 0) {
    iVar9 = iVar12;
  }
  local_486 = tcu::compareThreshold
                        ((RGBA)*(deUint32 *)
                                ((long)(result->m_pixels).m_ptr +
                                (long)(iVar2 * iVar15 + iVar13) * 4),cellColorA,threshold);
  tcu::Surface::Surface(&errorMask,result->m_width,result->m_height);
  uVar17 = iVar9 - iVar13;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&horisontalSign,(long)(int)uVar17,(allocator_type *)local_1b0);
  if (iVar16 < iVar18) {
    iVar16 = iVar18;
  }
  if (iVar16 < iVar19) {
    iVar19 = iVar16;
  }
  if (iVar16 < 0) {
    iVar19 = 0;
  }
  uVar20 = iVar19 - iVar15;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&verticalSign,(long)(int)uVar20,(allocator_type *)local_1b0);
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&errorMask);
  local_2d8.m_name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_2d8.m_name._M_string_length = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)&local_2d8);
  local_1b0._0_8_ =
       ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Verifying consistency of NEAREST filtering. Verifying rect ");
  tcu::operator<<((ostream *)poVar1,&(this->super_BlitRectCase).m_dstRect);
  std::operator<<((ostream *)poVar1,".\n");
  std::operator<<((ostream *)poVar1,
                  "Rounding direction of the NEAREST filter at the horisontal texel edge (x = n + 0.5) should not depend on the y-coordinate.\n"
                 );
  std::operator<<((ostream *)poVar1,
                  "Rounding direction of the NEAREST filter at the vertical texel edge (y = n + 0.5) should not depend on the x-coordinate.\n"
                 );
  std::operator<<((ostream *)poVar1,
                  "Blitting a grid (with uniform sized cells) should result in a grid (with non-uniform sized cells)."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  pvVar7 = (void *)0x0;
  if ((int)uVar17 < 1) {
    uVar17 = 0;
  }
  pvVar14 = (void *)(ulong)uVar20;
  if ((int)uVar20 < 1) {
    pvVar14 = pvVar7;
  }
  bVar10 = false;
  iVar11 = iVar15;
  for (; iVar18 = iVar13, uVar20 = uVar17, (int)pvVar7 != (int)pvVar14;
      pvVar7 = (void *)(ulong)((int)pvVar7 + 1)) {
    while (uVar20 != 0) {
      RVar3.m_value =
           *(deUint32 *)
            ((long)(result->m_pixels).m_ptr + (long)(result->m_width * iVar11 + iVar18) * 4);
      bVar4 = tcu::compareThreshold(RVar3,cellColorA,threshold);
      if ((!bVar4) && (bVar4 = tcu::compareThreshold(RVar3,cellColorB,threshold), !bVar4)) {
        *(undefined4 *)
         ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar11 + iVar18) * 4) =
             0xff0000ff;
        bVar10 = true;
      }
      iVar18 = iVar18 + 1;
      uVar20 = uVar20 - 1;
    }
    iVar11 = iVar11 + 1;
  }
  if (bVar10) {
    local_1b0._0_8_ =
         ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Image verification failed, destination rect contains unexpected values. ");
    std::operator<<((ostream *)poVar1,"Expected either ");
    tcu::operator<<((ostream *)poVar1,cellColorA);
    std::operator<<((ostream *)poVar1," or ");
    tcu::operator<<((ostream *)poVar1,cellColorB);
    std::operator<<((ostream *)poVar1,".");
    pTVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3e8,"Result",&local_487);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"Image verification result",&local_481);
    tcu::LogImageSet::LogImageSet(&local_368,(string *)local_3e8,&local_408);
    iVar11 = (int)pTVar6;
    tcu::LogImageSet::write(&local_368,iVar11,__buf,(size_t)pvVar7);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"Result",&local_482);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"Result",&local_483);
    tcu::LogImage::LogImage(&local_2d8,&local_428,&local_388,result,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_2d8,iVar11,__buf_00,(size_t)result);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"ErrorMask",&local_484);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_3e8 + 0x20),"Error mask",&local_485);
    pSVar8 = &errorMask;
    tcu::LogImage::LogImage
              (&local_240,&local_3a8,(string *)(local_3e8 + 0x20),pSVar8,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_240,iVar11,__buf_01,(size_t)pSVar8);
    tcu::TestLog::endImageSet(pTVar6);
    tcu::LogImage::~LogImage(&local_240);
    std::__cxx11::string::~string((string *)(local_3e8 + 0x20));
    std::__cxx11::string::~string((string *)&local_3a8);
    tcu::LogImage::~LogImage(&local_2d8);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_428);
    tcu::LogImageSet::~LogImageSet(&local_368);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)local_3e8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar10 = false;
  }
  else {
    for (sVar21 = 0; uVar17 != sVar21; sVar21 = sVar21 + 1) {
      pvVar7 = (result->m_pixels).m_ptr;
      RVar3.m_value =
           *(deUint32 *)((long)pvVar7 + (long)(result->m_width * iVar15 + iVar13 + (int)sVar21) * 4)
      ;
      bVar4 = tcu::compareThreshold(RVar3,cellColorA,threshold);
      if (bVar4) {
        rVar24 = std::vector<bool,_std::allocator<bool>_>::operator[](&horisontalSign,sVar21);
        *rVar24._M_p = *rVar24._M_p | rVar24._M_mask;
      }
      else {
        bVar4 = tcu::compareThreshold(RVar3,cellColorB,threshold);
        if (bVar4) {
          rVar24 = std::vector<bool,_std::allocator<bool>_>::operator[](&horisontalSign,sVar21);
          *rVar24._M_p = *rVar24._M_p & ~rVar24._M_mask;
        }
      }
    }
    for (pvVar22 = (void *)0x0; pvVar14 != pvVar22; pvVar22 = (void *)((long)pvVar22 + 1)) {
      pvVar7 = (result->m_pixels).m_ptr;
      RVar3.m_value =
           *(deUint32 *)
            ((long)pvVar7 + (long)((iVar15 + (int)pvVar22) * result->m_width + iVar13) * 4);
      bVar4 = tcu::compareThreshold(RVar3,cellColorA,threshold);
      if (bVar4) {
        rVar24 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&verticalSign,(size_type)pvVar22);
        *rVar24._M_p = *rVar24._M_p | rVar24._M_mask;
      }
      else {
        bVar4 = tcu::compareThreshold(RVar3,cellColorB,threshold);
        if (bVar4) {
          rVar24 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&verticalSign,(size_type)pvVar22);
          *rVar24._M_p = *rVar24._M_p & ~rVar24._M_mask;
        }
      }
    }
    for (pvVar22 = (void *)0x0; pvVar22 != pvVar14; pvVar22 = (void *)((long)pvVar22 + 1)) {
      for (sVar21 = 0; uVar17 != sVar21; sVar21 = sVar21 + 1) {
        pvVar7 = (result->m_pixels).m_ptr;
        bVar4 = tcu::compareThreshold
                          (cellColorA,
                           (RGBA)*(deUint32 *)
                                  ((long)pvVar7 +
                                  (long)(result->m_width * iVar15 + iVar13 + (int)sVar21) * 4),
                           threshold);
        rVar24 = std::vector<bool,_std::allocator<bool>_>::operator[](&horisontalSign,sVar21);
        rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&verticalSign,(size_type)pvVar22);
        bVar23 = (*rVar24._M_p & rVar24._M_mask) != 0;
        pvVar7 = (void *)CONCAT71((int7)((ulong)pvVar7 >> 8),bVar23);
        if (bVar4 == (bool)(((*rVar25._M_p & rVar25._M_mask) == 0) != bVar23 ^ local_486)) {
          *(undefined4 *)
           ((long)errorMask.m_pixels.m_ptr +
           (long)(errorMask.m_width * iVar15 + iVar13 + (int)sVar21) * 4) = 0xff0000ff;
          bVar10 = true;
          pvVar7 = errorMask.m_pixels.m_ptr;
        }
      }
      iVar15 = iVar15 + 1;
    }
    if (bVar10) {
      local_1b0._0_8_ =
           ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Image verification failed, nearest filter is not consistent.");
      pTVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_3e8,"Result",&local_487);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"Image verification result",&local_481);
      tcu::LogImageSet::LogImageSet(&local_368,(string *)local_3e8,&local_408);
      iVar11 = (int)pTVar6;
      tcu::LogImageSet::write(&local_368,iVar11,__buf_02,(size_t)pvVar7);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"Result",&local_482);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"Result",&local_483);
      tcu::LogImage::LogImage
                (&local_2d8,&local_428,&local_388,result,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_2d8,iVar11,__buf_03,(size_t)result);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a8,"ErrorMask",&local_484);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_3e8 + 0x20),"Error mask",&local_485);
      pSVar8 = &errorMask;
      tcu::LogImage::LogImage
                (&local_240,&local_3a8,(string *)(local_3e8 + 0x20),pSVar8,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_240,iVar11,__buf_04,(size_t)pSVar8);
      tcu::TestLog::endImageSet(pTVar6);
      tcu::LogImage::~LogImage(&local_240);
      std::__cxx11::string::~string((string *)(local_3e8 + 0x20));
      std::__cxx11::string::~string((string *)&local_3a8);
      tcu::LogImage::~LogImage(&local_2d8);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_428);
      tcu::LogImageSet::~LogImageSet(&local_368);
      std::__cxx11::string::~string((string *)&local_408);
      this_00 = (LogImageSet *)local_3e8;
    }
    else {
      local_1b0._0_8_ =
           ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"Image verification passed.");
      pTVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_368,"Result",(allocator<char> *)&local_388);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3e8,"Image verification result",(allocator<char> *)&local_3a8);
      tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,&local_368.m_name,(string *)local_3e8)
      ;
      tcu::LogImageSet::write((LogImageSet *)&local_240,(int)pTVar6,__buf_05,(size_t)pvVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"Result",(allocator<char> *)(local_3e8 + 0x20));
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"Result",&local_487);
      tcu::LogImage::LogImage
                (&local_2d8,&local_408,&local_428,result,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_2d8,(int)pTVar6,__buf_06,(size_t)result);
      tcu::TestLog::endImageSet(pTVar6);
      tcu::LogImage::~LogImage(&local_2d8);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_408);
      tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_240);
      std::__cxx11::string::~string((string *)local_3e8);
      this_00 = &local_368;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    bVar10 = (bool)(bVar10 ^ 1);
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&verticalSign.super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&horisontalSign.super__Bvector_base<std::allocator<bool>_>);
  tcu::Surface::~Surface(&errorMask);
  return bVar10;
}

Assistant:

bool BlitNearestFilterConsistencyCase::compare (const tcu::Surface& reference, const tcu::Surface& result)
{
	DE_ASSERT(reference.getWidth() == result.getWidth());
	DE_ASSERT(reference.getHeight() == result.getHeight());
	DE_UNREF(reference);

	// Image origin must be visible (for baseColor)
	DE_ASSERT(de::min(m_dstRect.x(), m_dstRect.z()) >= 0);
	DE_ASSERT(de::min(m_dstRect.y(), m_dstRect.w()) >= 0);

	const tcu::RGBA		cellColorA		(m_gridCellColorA);
	const tcu::RGBA		cellColorB		(m_gridCellColorB);
	const tcu::RGBA		threshold		= TestCase::m_context.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(7,7,7,7);
	const tcu::IVec4	destinationArea	= tcu::IVec4(de::clamp(de::min(m_dstRect.x(), m_dstRect.z()), 0, result.getWidth()),
													 de::clamp(de::min(m_dstRect.y(), m_dstRect.w()), 0, result.getHeight()),
													 de::clamp(de::max(m_dstRect.x(), m_dstRect.z()), 0, result.getWidth()),
													 de::clamp(de::max(m_dstRect.y(), m_dstRect.w()), 0, result.getHeight()));
	const tcu::RGBA		baseColor		= result.getPixel(destinationArea.x(), destinationArea.y());
	const bool			signConfig		= tcu::compareThreshold(baseColor, cellColorA, threshold);

	bool				error			= false;
	tcu::Surface		errorMask		(result.getWidth(), result.getHeight());
	std::vector<bool>	horisontalSign	(destinationArea.z() - destinationArea.x());
	std::vector<bool>	verticalSign	(destinationArea.w() - destinationArea.y());

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	// Checking only area in our destination rect

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying consistency of NEAREST filtering. Verifying rect " << m_dstRect << ".\n"
		<< "Rounding direction of the NEAREST filter at the horisontal texel edge (x = n + 0.5) should not depend on the y-coordinate.\n"
		<< "Rounding direction of the NEAREST filter at the vertical texel edge (y = n + 0.5) should not depend on the x-coordinate.\n"
		<< "Blitting a grid (with uniform sized cells) should result in a grid (with non-uniform sized cells)."
		<< tcu::TestLog::EndMessage;

	// Verify that destination only contains valid colors

	for (int dy = 0; dy < destinationArea.w() - destinationArea.y(); ++dy)
	for (int dx = 0; dx < destinationArea.z() - destinationArea.x(); ++dx)
	{
		const tcu::RGBA	color	= result.getPixel(destinationArea.x() + dx, destinationArea.y() + dy);
		const bool isValidColor = tcu::compareThreshold(color, cellColorA, threshold) || tcu::compareThreshold(color, cellColorB, threshold);

		if (!isValidColor)
		{
			errorMask.setPixel(destinationArea.x() + dx, destinationArea.y() + dy, tcu::RGBA::red());
			error = true;
		}
	}
	if (error)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed, destination rect contains unexpected values. "
			<< "Expected either " << cellColorA << " or " << cellColorB << "."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Result", "Image verification result")
			<< tcu::TestLog::Image("Result",	"Result",		result)
			<< tcu::TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
		return false;
	}

	// Detect result edges by reading the first row and first column of the blitted area.
	// Blitting a grid should result in a grid-like image. ("sign changes" should be consistent)

	for (int dx = 0; dx < destinationArea.z() - destinationArea.x(); ++dx)
	{
		const tcu::RGBA color = result.getPixel(destinationArea.x() + dx, destinationArea.y());

		if (tcu::compareThreshold(color, cellColorA, threshold))
			horisontalSign[dx] = true;
		else if (tcu::compareThreshold(color, cellColorB, threshold))
			horisontalSign[dx] = false;
		else
			DE_ASSERT(DE_FALSE);
	}
	for (int dy = 0; dy < destinationArea.w() - destinationArea.y(); ++dy)
	{
		const tcu::RGBA color = result.getPixel(destinationArea.x(), destinationArea.y() + dy);

		if (tcu::compareThreshold(color, cellColorA, threshold))
			verticalSign[dy] = true;
		else if (tcu::compareThreshold(color, cellColorB, threshold))
			verticalSign[dy] = false;
		else
			DE_ASSERT(DE_FALSE);
	}

	// Verify grid-like image

	for (int dy = 0; dy < destinationArea.w() - destinationArea.y(); ++dy)
	for (int dx = 0; dx < destinationArea.z() - destinationArea.x(); ++dx)
	{
		const tcu::RGBA	color		= result.getPixel(destinationArea.x() + dx, destinationArea.y() + dy);
		const bool		resultSign	= tcu::compareThreshold(cellColorA, color, threshold);
		const bool		correctSign	= (horisontalSign[dx] == verticalSign[dy]) == signConfig;

		if (resultSign != correctSign)
		{
			errorMask.setPixel(destinationArea.x() + dx, destinationArea.y() + dy, tcu::RGBA::red());
			error = true;
		}
	}

	// Report result

	if (error)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed, nearest filter is not consistent."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Result", "Image verification result")
			<< tcu::TestLog::Image("Result",	"Result",		result)
			<< tcu::TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification passed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Result", "Image verification result")
			<< tcu::TestLog::Image("Result", "Result", result)
			<< tcu::TestLog::EndImageSet;
	}

	return !error;
}